

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O1

string * __thiscall
CLI::detail::join<std::set<int,std::less<int>,std::allocator<int>>>
          (string *__return_storage_ptr__,detail *this,
          set<int,_std::less<int>,_std::allocator<int>_> *v,string *delim)

{
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  bool bVar3;
  ostringstream s;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  p_Var1 = *(_Rb_tree_node_base **)(this + 0x18);
  if (p_Var1 != (_Rb_tree_node_base *)(this + 8)) {
    lVar2 = 0;
    do {
      bVar3 = lVar2 != 0;
      lVar2 = lVar2 + -1;
      if (bVar3) {
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1a8,*(char **)&(v->_M_t)._M_impl,
                   *(long *)&(v->_M_t)._M_impl.super__Rb_tree_header._M_header);
      }
      ::std::ostream::operator<<((ostream *)aoStack_1a8,p_Var1[1]._M_color);
      p_Var1 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != (_Rb_tree_node_base *)(this + 8));
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string join(const T &v, std::string delim = ",") {
    std::ostringstream s;
    size_t start = 0;
    for(const auto &i : v) {
        if(start++ > 0)
            s << delim;
        s << i;
    }
    return s.str();
}